

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O3

int telnet_vprintf(telnet_t *telnet,char *fmt,__va_list_tag *va)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  int *piVar4;
  char cVar5;
  char *buffer_00;
  ulong uVar6;
  va_list va_temp;
  char buffer [1024];
  char local_45a [2];
  undefined8 local_458;
  void *pvStack_450;
  void *local_448;
  char local_438 [1032];
  
  local_458._0_4_ = va->gp_offset;
  local_458._4_4_ = va->fp_offset;
  pvStack_450 = va->overflow_arg_area;
  local_448 = va->reg_save_area;
  pcVar3 = local_438;
  uVar1 = vsnprintf(pcVar3,0x400,fmt,&local_458);
  if (0x3ff < uVar1) {
    pcVar3 = (char *)malloc((ulong)(uVar1 + 1));
    if (pcVar3 == (char *)0x0) {
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      _error(telnet,0x665,"telnet_vprintf",TELNET_ENOMEM,0,"malloc() failed: %s",pcVar3);
      return -1;
    }
    local_448 = va->reg_save_area;
    local_458._0_4_ = va->gp_offset;
    local_458._4_4_ = va->fp_offset;
    pvStack_450 = va->overflow_arg_area;
    uVar1 = vsnprintf(pcVar3,(ulong)(uVar1 + 1),fmt,&local_458);
  }
  if (uVar1 != 0) {
    uVar6 = 0;
    uVar2 = 0;
    do {
      cVar5 = pcVar3[uVar6];
      if (((cVar5 == '\n') || (cVar5 == '\r')) || (cVar5 == -1)) {
        if (uVar6 != uVar2) {
          _send(telnet,pcVar3 + uVar2,(ulong)((int)uVar6 - uVar2));
          cVar5 = pcVar3[uVar6];
        }
        uVar2 = (int)uVar6 + 1;
        if (cVar5 == '\n') {
          buffer_00 = "\r\n";
        }
        else if (cVar5 == '\r') {
          buffer_00 = "\r";
        }
        else {
          if (cVar5 != -1) goto LAB_00103165;
          local_45a[0] = -1;
          local_45a[1] = -1;
          buffer_00 = local_45a;
        }
        _send(telnet,buffer_00,2);
      }
LAB_00103165:
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar1);
    if (uVar1 - uVar2 != 0) {
      _send(telnet,pcVar3 + uVar2,(ulong)(uVar1 - uVar2));
    }
  }
  if (pcVar3 != local_438) {
    free(pcVar3);
  }
  return uVar1;
}

Assistant:

int telnet_vprintf(telnet_t *telnet, const char *fmt, va_list va) {
	va_list va_temp;
	char buffer[1024];
	char *output = buffer;
	unsigned int rs, i, l;

	/* format */
	va_copy(va_temp, va);
	rs = vsnprintf(buffer, sizeof(buffer), fmt, va_temp);
	va_end(va_temp);

	if (rs >= sizeof(buffer)) {
		output = (char*)malloc(rs + 1);
		if (output == 0) {
			_error(telnet, __LINE__, __func__, TELNET_ENOMEM, 0,
					"malloc() failed: %s", strerror(errno));
			return -1;
		}

		va_copy(va_temp, va);
		rs = vsnprintf(output, rs + 1, fmt, va_temp);
		va_end(va_temp);
	}

	/* send */
	for (l = i = 0; i != rs; ++i) {
		/* special characters */
		if (output[i] == (char)TELNET_IAC || output[i] == '\r' ||
				output[i] == '\n') {
			/* dump prior portion of text */
			if (i != l)
				_send(telnet, output + l, i - l);
			l = i + 1;

			/* IAC -> IAC IAC */
			if (output[i] == (char)TELNET_IAC)
				telnet_iac(telnet, TELNET_IAC);
			/* automatic translation of \r -> CRNUL */
			else if (output[i] == '\r')
				_send(telnet, CRNUL, 2);
			/* automatic translation of \n -> CRLF */
			else if (output[i] == '\n')
				_send(telnet, CRLF, 2);
		}
	}

	/* send whatever portion of output is left */
	if (i != l) {
		_send(telnet, output + l, i - l);
	}

	/* free allocated memory, if any */
	if (output != buffer) {
		free(output);
	}

	return rs;
}